

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

void Gia_ManCleanTruth(Gia_Man_t *p)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  uint uVar4;
  
  pVVar2 = p->vTruths;
  uVar1 = p->nObjs;
  if (pVVar2 == (Vec_Int_t *)0x0) {
    pVVar2 = (Vec_Int_t *)malloc(0x10);
    uVar4 = 0x10;
    if (0xe < uVar1 - 1) {
      uVar4 = uVar1;
    }
    pVVar2->nSize = 0;
    pVVar2->nCap = uVar4;
    if (uVar4 == 0) {
      piVar3 = (int *)0x0;
    }
    else {
      piVar3 = (int *)malloc((long)(int)uVar4 << 2);
    }
    pVVar2->pArray = piVar3;
    p->vTruths = pVVar2;
  }
  else {
    uVar4 = pVVar2->nCap;
  }
  if ((int)uVar4 < (int)uVar1) {
    if (pVVar2->pArray == (int *)0x0) {
      piVar3 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar3 = (int *)realloc(pVVar2->pArray,(long)(int)uVar1 << 2);
    }
    pVVar2->pArray = piVar3;
    if (piVar3 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar2->nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset(pVVar2->pArray,0xff,(ulong)uVar1 * 4);
  }
  pVVar2->nSize = uVar1;
  return;
}

Assistant:

void Gia_ManCleanTruth( Gia_Man_t * p )
{
    if ( p->vTruths == NULL )
        p->vTruths = Vec_IntAlloc( Gia_ManObjNum(p) );
    Vec_IntFill( p->vTruths, Gia_ManObjNum(p), -1 );
}